

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

int nn_node_check_prefix(nn_trie_node *self,uint8_t *data,size_t size)

{
  uint local_2c;
  size_t sStack_28;
  int i;
  size_t size_local;
  uint8_t *data_local;
  nn_trie_node *self_local;
  
  local_2c = 0;
  sStack_28 = size;
  size_local = (size_t)data;
  while( true ) {
    if (local_2c == self->prefix_len) {
      return (uint)self->prefix_len;
    }
    if ((sStack_28 == 0) || (self->prefix[(int)local_2c] != *(uint8_t *)size_local)) break;
    size_local = size_local + 1;
    sStack_28 = sStack_28 - 1;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

int nn_node_check_prefix (struct nn_trie_node *self,
    const uint8_t *data, size_t size)
{
    /*  Check how many characters from the data match the prefix. */

    int i;

    for (i = 0; i != self->prefix_len; ++i) {
        if (!size || self->prefix [i] != *data)
            return i;
        ++data;
        --size;
    }
    return self->prefix_len;
}